

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *__s;
  
  progname = *argv;
  ignore_case = 0;
  test_files = 0;
  paranoid = 0;
  verbose = 1;
LAB_001023ee:
  do {
    iVar1 = getopt(argc,argv,"hVipqtv");
    switch(iVar1) {
    case 0x68:
      fputs(help_head,_stdout);
      printf("usage: %s [-hipqtVv] archive1 archive2\n",progname);
      __s = help;
LAB_0010249a:
      fputs(__s,_stdout);
      exit(0);
    case 0x69:
      ignore_case = 1;
      break;
    case 0x70:
      paranoid = 1;
      break;
    case 0x71:
      verbose = 0;
      break;
    case 0x74:
      test_files = 1;
      break;
    case 0x76:
      goto switchD_0010240a_caseD_76;
    default:
      if (iVar1 == -1) {
        if (_optind + 2 == argc) {
          compare_zip(argv + _optind);
        }
      }
      else if (iVar1 == 0x56) {
        __s = version_string;
        goto LAB_0010249a;
      }
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x72:
    case 0x73:
    case 0x75:
      fprintf(_stderr,"usage: %s [-hipqtVv] archive1 archive2\n",progname);
      exit(2);
    }
  } while( true );
switchD_0010240a_caseD_76:
  verbose = 1;
  goto LAB_001023ee;
}

Assistant:

int
main(int argc, char *const argv[]) {
    int c;

    progname = argv[0];

    ignore_case = 0;
    test_files = 0;
    paranoid = 0;
    verbose = 1;

    while ((c = getopt(argc, argv, OPTIONS)) != -1) {
	switch (c) {
	case 'i':
	    ignore_case = 1;
	    break;
	case 'p':
	    paranoid = 1;
	    break;
	case 'q':
	    verbose = 0;
	    break;
	case 't':
	    test_files = 1;
	    break;
	case 'v':
	    verbose = 1;
	    break;

	case 'h':
	    fputs(help_head, stdout);
	    printf(USAGE, progname);
	    fputs(help, stdout);
	    exit(0);
	case 'V':
	    fputs(version_string, stdout);
	    exit(0);

	default:
	    fprintf(stderr, USAGE, progname);
	    exit(2);
	}
    }

    if (argc != optind + 2) {
	fprintf(stderr, USAGE, progname);
	exit(2);
    }

    exit((compare_zip(argv + optind) == 0) ? 0 : 1);
}